

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

int drmp3_hdr_compare(drmp3_uint8 *h1,drmp3_uint8 *h2)

{
  int iVar1;
  drmp3_uint8 *in_RSI;
  long in_RDI;
  byte local_11;
  
  iVar1 = drmp3_hdr_valid(in_RSI);
  local_11 = 0;
  if (((iVar1 != 0) && (local_11 = 0, ((*(byte *)(in_RDI + 1) ^ in_RSI[1]) & 0xfe) == 0)) &&
     (local_11 = 0, ((*(byte *)(in_RDI + 2) ^ in_RSI[2]) & 0xc) == 0)) {
    local_11 = ((*(byte *)(in_RDI + 2) & 0xf0) == 0) != ((in_RSI[2] & 0xf0) == 0) ^ 0xff;
  }
  return (int)(local_11 & 1);
}

Assistant:

static int drmp3_hdr_compare(const drmp3_uint8 *h1, const drmp3_uint8 *h2)
{
    return drmp3_hdr_valid(h2) &&
           ((h1[1] ^ h2[1]) & 0xFE) == 0 &&
           ((h1[2] ^ h2[2]) & 0x0C) == 0 &&
           !(DRMP3_HDR_IS_FREE_FORMAT(h1) ^ DRMP3_HDR_IS_FREE_FORMAT(h2));
}